

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O1

Variable __thiscall
LiteScript::_Type_STRING::OAssign(_Type_STRING *this,Variable *src,Variable *dest)

{
  String *string;
  bool bVar1;
  Object *pOVar2;
  Type *pTVar3;
  Variable *in_RCX;
  uint *extraout_RDX;
  Variable VVar4;
  Variable VStack_38;
  
  pOVar2 = Variable::operator->(in_RCX);
  pTVar3 = Object::GetType(pOVar2);
  bVar1 = Type::operator!=(pTVar3,(Type *)src);
  pOVar2 = Variable::operator->(in_RCX);
  if (bVar1) {
    pTVar3 = Object::GetType(pOVar2);
    pOVar2 = Variable::operator*(dest);
    (*pTVar3->_vptr_Type[1])(pTVar3,pOVar2);
    pOVar2 = Variable::operator->(dest);
    pTVar3 = Object::GetType(pOVar2);
    (*pTVar3->_vptr_Type[3])(&VStack_38,pTVar3,dest);
    Variable::~Variable(&VStack_38);
  }
  else {
    string = (String *)pOVar2->data;
    pOVar2 = Variable::operator->(dest);
    String::operator=((String *)pOVar2->data,string);
  }
  Variable::Variable((Variable *)this,dest);
  VVar4.nb_ref = extraout_RDX;
  VVar4.obj = (Object *)this;
  return VVar4;
}

Assistant:

LiteScript::Variable LiteScript::_Type_STRING::OAssign(LiteScript::Variable& src, const LiteScript::Variable& dest) const {
    if (dest->GetType() != *this) {
        dest->GetType().AssignObject(*src);
        src->GetType().OAssign(src, dest);
    }
    else {
        src->GetData<String>() = dest->GetData<String>();
    }
    return Variable(src);
}